

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O2

void __thiscall
Clasp::ClaspVsids_t<Clasp::DomScore>::updateReason
          (ClaspVsids_t<Clasp::DomScore> *this,Solver *s,LitVec *lits,Literal r)

{
  uint uVar1;
  uint uVar2;
  uint v;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = this->scType_;
  if (1 < uVar4) {
    uVar1 = (lits->ebo_).size;
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      uVar2 = (lits->ebo_).buf[uVar3].rep_;
      v = uVar2 >> 2;
      if ((uVar4 == 3) || (((s->assign_).assign_.ebo_.buf[v] & (uVar2 & 2) * 2 + 4) == 0)) {
        updateVarActivity(this,s,v,1.0);
      }
    }
    uVar4 = this->scType_;
  }
  if (r.rep_ < 4 || (uVar4 & 1) == 0) {
    return;
  }
  updateVarActivity(this,s,r.rep_ >> 2,1.0);
  return;
}

Assistant:

void ClaspVsids_t<ScoreType>::updateReason(const Solver& s, const LitVec& lits, Literal r) {
	if (scType_ > HeuParams::score_min) {
		const bool ms = scType_ == HeuParams::score_multi_set;
		for (LitVec::size_type i = 0, end = lits.size(); i != end; ++i) {
			if (ms || !s.seen(lits[i])) { updateVarActivity(s, lits[i].var()); }
		}
	}
	if ((scType_ & 1u) != 0 && r.var() != 0) { updateVarActivity(s, r.var()); }
}